

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

CaseFold * re2::LookupCaseFold(CaseFold *f,int n,Rune r)

{
  int iVar1;
  int m;
  CaseFold *ef;
  Rune r_local;
  int n_local;
  CaseFold *f_local;
  
  iVar1 = n;
  _r_local = f;
  while( true ) {
    ef._4_4_ = iVar1;
    if (ef._4_4_ < 1) {
      if (_r_local < f + n) {
        f_local = _r_local;
      }
      else {
        f_local = (CaseFold *)0x0;
      }
      return f_local;
    }
    iVar1 = ef._4_4_ / 2;
    if ((_r_local[iVar1].lo <= r) && (r <= _r_local[iVar1].hi)) break;
    if (_r_local[iVar1].lo <= r) {
      _r_local = _r_local + (iVar1 + 1);
      iVar1 = ef._4_4_ - (iVar1 + 1);
    }
  }
  return _r_local + iVar1;
}

Assistant:

const CaseFold* LookupCaseFold(const CaseFold *f, int n, Rune r) {
  const CaseFold* ef = f + n;

  // Binary search for entry containing r.
  while (n > 0) {
    int m = n/2;
    if (f[m].lo <= r && r <= f[m].hi)
      return &f[m];
    if (r < f[m].lo) {
      n = m;
    } else {
      f += m+1;
      n -= m+1;
    }
  }

  // There is no entry that contains r, but f points
  // where it would have been.  Unless f points at
  // the end of the array, it points at the next entry
  // after r.
  if (f < ef)
    return f;

  // No entry contains r; no entry contains runes > r.
  return NULL;
}